

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * __thiscall
util::make_string<std::__cxx11::string&>
          (string *__return_storage_ptr__,util *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  ostringstream ss;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,(string *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}